

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O2

void __thiscall
cmLocalUnixMakefileGenerator3::AppendEcho
          (cmLocalUnixMakefileGenerator3 *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *commands,string *text,EchoColor color,EchoProgress *progress)

{
  cmAlphaNum *a;
  char cVar1;
  char *pcVar2;
  cmAlphaNum *this_00;
  cmOutputConverter *this_01;
  string_view str;
  string_view source;
  string_view str_00;
  string line;
  string cmd;
  string color_name;
  undefined1 local_d0 [40];
  char *local_a8;
  cmAlphaNum local_80;
  string local_50;
  
  color_name._M_dataplus._M_p = (pointer)&color_name.field_2;
  color_name._M_string_length = 0;
  color_name.field_2._M_local_buf[0] = '\0';
  if (((((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
        ToolSupportsColor == true) && (this->ColorMakefile == true)) && (color - EchoDepend < 5)) {
    std::__cxx11::string::assign((char *)&color_name);
  }
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)&line);
  pcVar2 = (text->_M_dataplus)._M_p;
  this_01 = &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter;
  a = (cmAlphaNum *)(local_d0 + 0x20);
  do {
    cVar1 = *pcVar2;
    if (cVar1 != '\r') {
      if (cVar1 == '\n') {
LAB_00341966:
        cmd._M_dataplus._M_p = (pointer)&cmd.field_2;
        cmd._M_string_length = 0;
        cmd.field_2._M_local_buf[0] = '\0';
        if (color_name._M_string_length == 0 && progress == (EchoProgress *)0x0) {
          local_d0[0x20] = '\x06';
          local_d0[0x21] = '\0';
          local_d0[0x22] = '\0';
          local_d0[0x23] = '\0';
          local_d0[0x24] = '\0';
          local_d0[0x25] = '\0';
          local_d0[0x26] = '\0';
          local_d0[0x27] = '\0';
          local_a8 = "@echo ";
          str._M_str = line._M_dataplus._M_p;
          str._M_len = line._M_string_length;
          cmOutputConverter::EscapeForShell_abi_cxx11_
                    ((string *)local_d0,this_01,str,false,true,false,false,false);
          local_80.View_._M_len = local_d0._8_8_;
          local_80.View_._M_str = (char *)local_d0._0_8_;
          cmStrCat<>(&local_50,a,&local_80);
          std::__cxx11::string::operator=((string *)&cmd,(string *)&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          this_00 = (cmAlphaNum *)local_d0;
        }
        else {
          local_d0[0x20] = '8';
          local_d0[0x21] = '\0';
          local_d0[0x22] = '\0';
          local_d0[0x23] = '\0';
          local_d0[0x24] = '\0';
          local_d0[0x25] = '\0';
          local_d0[0x26] = '\0';
          local_d0[0x27] = '\0';
          local_a8 = "@$(CMAKE_COMMAND) -E cmake_echo_color --switch=$(COLOR) ";
          local_80.View_._M_len = color_name._M_string_length;
          local_80.View_._M_str = color_name._M_dataplus._M_p;
          cmStrCat<>(&local_50,a,&local_80);
          std::__cxx11::string::operator=((string *)&cmd,(string *)&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          if (progress != (EchoProgress *)0x0) {
            std::__cxx11::string::append((char *)&cmd);
            source._M_str = (progress->Dir)._M_dataplus._M_p;
            source._M_len = (progress->Dir)._M_string_length;
            cmOutputConverter::ConvertToOutputFormat_abi_cxx11_((string *)a,this_01,source,SHELL);
            std::__cxx11::string::append((string *)&cmd);
            std::__cxx11::string::~string((string *)a);
            std::__cxx11::string::append((char *)&cmd);
            std::__cxx11::string::append((char *)&cmd);
            std::__cxx11::string::append((string *)&cmd);
            std::__cxx11::string::append((char *)&cmd);
          }
          str_00._M_str = line._M_dataplus._M_p;
          str_00._M_len = line._M_string_length;
          cmOutputConverter::EscapeForShell_abi_cxx11_
                    ((string *)a,this_01,str_00,false,false,false,false,false);
          std::__cxx11::string::append((string *)&cmd);
          this_00 = a;
        }
        std::__cxx11::string::~string((string *)this_00);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)commands,
                   &cmd);
        std::__cxx11::string::~string((string *)&cmd);
      }
      else {
        if (cVar1 != '\0') {
          std::__cxx11::string::push_back((char)&line);
          goto LAB_00341b5f;
        }
        if (line._M_string_length != 0) goto LAB_00341966;
      }
      line._M_string_length = 0;
      *line._M_dataplus._M_p = '\0';
      if (*pcVar2 == '\0') {
        std::__cxx11::string::~string((string *)&line);
        std::__cxx11::string::~string((string *)&color_name);
        return;
      }
      progress = (EchoProgress *)0x0;
    }
LAB_00341b5f:
    pcVar2 = pcVar2 + 1;
  } while( true );
}

Assistant:

void cmLocalUnixMakefileGenerator3::AppendEcho(
  std::vector<std::string>& commands, std::string const& text, EchoColor color,
  EchoProgress const* progress)
{
  // Choose the color for the text.
  std::string color_name;
  if (this->GlobalGenerator->GetToolSupportsColor() && this->ColorMakefile) {
    // See cmake::ExecuteEchoColor in cmake.cxx for these options.
    // This color set is readable on both black and white backgrounds.
    switch (color) {
      case EchoNormal:
        break;
      case EchoDepend:
        color_name = "--magenta --bold ";
        break;
      case EchoBuild:
        color_name = "--green ";
        break;
      case EchoLink:
        color_name = "--green --bold ";
        break;
      case EchoGenerate:
        color_name = "--blue --bold ";
        break;
      case EchoGlobal:
        color_name = "--cyan ";
        break;
    }
  }

  // Echo one line at a time.
  std::string line;
  line.reserve(200);
  for (const char* c = text.c_str();; ++c) {
    if (*c == '\n' || *c == '\0') {
      // Avoid writing a blank last line on end-of-string.
      if (*c != '\0' || !line.empty()) {
        // Add a command to echo this line.
        std::string cmd;
        if (color_name.empty() && !progress) {
          // Use the native echo command.
          cmd = cmStrCat("@echo ", this->EscapeForShell(line, false, true));
        } else {
          // Use cmake to echo the text in color.
          cmd = cmStrCat(
            "@$(CMAKE_COMMAND) -E cmake_echo_color --switch=$(COLOR) ",
            color_name);
          if (progress) {
            cmd += "--progress-dir=";
            cmd += this->ConvertToOutputFormat(progress->Dir,
                                               cmOutputConverter::SHELL);
            cmd += " ";
            cmd += "--progress-num=";
            cmd += progress->Arg;
            cmd += " ";
          }
          cmd += this->EscapeForShell(line);
        }
        commands.push_back(std::move(cmd));
      }

      // Reset the line to empty.
      line.clear();

      // Progress appears only on first line.
      progress = nullptr;

      // Terminate on end-of-string.
      if (*c == '\0') {
        return;
      }
    } else if (*c != '\r') {
      // Append this character to the current line.
      line += *c;
    }
  }
}